

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

bool HasTestOption(ArgsManager *args,string *test_option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  _Alloc_hider __s2;
  size_type sVar4;
  int iVar5;
  pointer pbVar6;
  pointer pbVar7;
  long lVar8;
  pointer pbVar9;
  pointer pbVar10;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-test","");
  ArgsManager::GetArgs(&local_110,args,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_f8 = local_e8;
  pcVar2 = (test_option->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + test_option->_M_string_length);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_f8,local_f0 + (long)local_f8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_d8,local_d0 + (long)local_d8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_b8,local_b0 + (long)local_b8);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_98,local_90 + (long)local_98);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_70 + (long)local_78);
  sVar4 = local_58._M_string_length;
  __s2._M_p = local_58._M_dataplus._M_p;
  lVar8 = (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 7;
  pbVar10 = local_110.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar8) {
    pbVar10 = (pointer)((long)&((local_110.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       ((long)local_110.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_110.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff80U));
    lVar8 = lVar8 + 1;
    pbVar6 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    pbVar9 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar3 = pbVar6[-2]._M_string_length;
      if (sVar3 == sVar4) {
        if (sVar3 == 0) {
          pbVar7 = pbVar6 + -2;
          goto LAB_00d3e6dc;
        }
        iVar5 = bcmp(pbVar6[-2]._M_dataplus._M_p,__s2._M_p,sVar3);
        pbVar7 = pbVar9;
        if (iVar5 == 0) goto LAB_00d3e6dc;
      }
      sVar3 = pbVar6[-1]._M_string_length;
      if (sVar3 == sVar4) {
        if (sVar3 == 0) {
          pbVar7 = pbVar9 + 1;
          goto LAB_00d3e6dc;
        }
        iVar5 = bcmp(pbVar6[-1]._M_dataplus._M_p,__s2._M_p,sVar3);
        if (iVar5 == 0) {
          pbVar7 = pbVar6 + -1;
          goto LAB_00d3e6dc;
        }
      }
      sVar3 = pbVar6->_M_string_length;
      if (sVar3 == sVar4) {
        pbVar7 = pbVar6;
        if (sVar3 == 0) goto LAB_00d3e6dc;
        iVar5 = bcmp((pbVar6->_M_dataplus)._M_p,__s2._M_p,sVar3);
        if (iVar5 == 0) {
          pbVar7 = pbVar9 + 2;
          goto LAB_00d3e6dc;
        }
      }
      sVar3 = pbVar6[1]._M_string_length;
      if (sVar3 == sVar4) {
        if (sVar3 == 0) {
          pbVar7 = pbVar9 + 3;
          goto LAB_00d3e6dc;
        }
        iVar5 = bcmp(pbVar6[1]._M_dataplus._M_p,__s2._M_p,sVar3);
        if (iVar5 == 0) {
          pbVar7 = pbVar6 + 1;
          goto LAB_00d3e6dc;
        }
      }
      pbVar9 = pbVar9 + 4;
      lVar8 = lVar8 + -1;
      pbVar6 = pbVar6 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pbVar7 = local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar8 != 3) ||
         ((sVar3 = pbVar10->_M_string_length, sVar3 == local_58._M_string_length &&
          ((pbVar7 = pbVar10, sVar3 == 0 ||
           (iVar5 = bcmp((pbVar10->_M_dataplus)._M_p,local_58._M_dataplus._M_p,sVar3), iVar5 == 0)))
          ))) goto LAB_00d3e6dc;
      pbVar10 = pbVar10 + 1;
    }
    sVar3 = pbVar10->_M_string_length;
    if ((sVar3 == local_58._M_string_length) &&
       ((pbVar7 = pbVar10, sVar3 == 0 ||
        (iVar5 = bcmp((pbVar10->_M_dataplus)._M_p,local_58._M_dataplus._M_p,sVar3), iVar5 == 0))))
    goto LAB_00d3e6dc;
    pbVar10 = pbVar10 + 1;
  }
  sVar3 = pbVar10->_M_string_length;
  pbVar7 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((sVar3 == local_58._M_string_length) && (pbVar7 = pbVar10, sVar3 != 0)) &&
     (iVar5 = bcmp((pbVar10->_M_dataplus)._M_p,local_58._M_dataplus._M_p,sVar3), iVar5 != 0)) {
    pbVar7 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00d3e6dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pbVar7 != local_110.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool HasTestOption(const ArgsManager& args, const std::string& test_option)
{
    const auto options = args.GetArgs("-test");
    return std::any_of(options.begin(), options.end(), [test_option](const auto& option) {
        return option == test_option;
    });
}